

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O2

FIOBJ fiobj_hash_get2(FIOBJ hash,uint64_t key_hash)

{
  FIOBJ FVar1;
  
  if (((uint)hash & 7) == 4) {
    FVar1 = fio_hash___find((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8),key_hash,
                            0xffffffffffffffff);
    return FVar1;
  }
  __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                ,0x138,"FIOBJ fiobj_hash_get2(const FIOBJ, uint64_t)");
}

Assistant:

FIOBJ fiobj_hash_get2(const FIOBJ hash, uint64_t key_hash) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  return fio_hash___find(&obj2hash(hash)->hash, key_hash, -1);
  ;
}